

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4489d7::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable
          (OwnershipAnalysis *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppSVar2;
  pointer ppVar3;
  BuildNode *pBVar4;
  Command *pCVar5;
  pointer __s1;
  size_t sVar6;
  size_t __n;
  BuildNode *pBVar7;
  iterator __position;
  StringRef inputPath;
  iterator iVar8;
  bool bVar9;
  int iVar10;
  Command *pCVar11;
  _Base_ptr p_Var12;
  pointer ppVar13;
  long lVar14;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  __it;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  __it_00;
  iterator iVar15;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_68;
  iterator iStack_60;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_58;
  StringRef local_48;
  pointer local_38;
  
  local_68 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  iStack_60._M_current =
       (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  local_58 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0;
  ppVar13 = (this->directoryInputNodesAndCommands).
            super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->directoryInputNodesAndCommands).
           super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 != ppVar3) {
    p_Var1 = &(this->excludedPaths)._M_t._M_impl.super__Rb_tree_header;
    do {
      pBVar4 = ppVar13->first;
      pCVar5 = ppVar13->second;
      inputPath.Data = (pBVar4->super_Node).name._M_dataplus._M_p;
      inputPath.Length = (pBVar4->super_Node).name._M_string_length;
      pCVar11 = includedOwnerOf(this,inputPath);
      if (pCVar11 == (Command *)0x0) {
        p_Var12 = (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)p_Var12 != p_Var1) {
          __s1 = (pBVar4->super_Node).name._M_dataplus._M_p;
          sVar6 = (pBVar4->super_Node).name._M_string_length;
          do {
            __n = *(size_t *)(*(long *)(p_Var12 + 1) + 0x10);
            if ((__n == sVar6) &&
               ((__n == 0 ||
                (iVar10 = bcmp(__s1,*(void **)(*(long *)(p_Var12 + 1) + 8),__n), iVar10 == 0))))
            break;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          } while ((_Rb_tree_header *)p_Var12 != p_Var1);
        }
        if ((((_Rb_tree_header *)p_Var12 == p_Var1) || (p_Var12[1]._M_parent == (_Base_ptr)0x0)) &&
           (pCVar5->repairViaOwnershipAnalysis == true)) {
          if (iStack_60._M_current == local_58) {
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>const&>
                      ((vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                        *)&local_68,iStack_60,ppVar13);
          }
          else {
            pCVar5 = ppVar13->second;
            (iStack_60._M_current)->first = ppVar13->first;
            (iStack_60._M_current)->second = pCVar5;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != ppVar3);
  }
  ppVar13 = (this->outputNodesAndCommands).
            super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->outputNodesAndCommands).
             super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 != local_38) {
    do {
      iVar8._M_current = iStack_60._M_current;
      pBVar4 = ppVar13->first;
      local_48.Length = (size_t)ppVar13->second;
      lVar14 = (long)iStack_60._M_current - (long)local_68 >> 6;
      __it_00._M_current = local_68;
      local_48.Data = (char *)pBVar4;
      if (0 < lVar14) {
        __it_00._M_current =
             (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
             ((long)&local_68->first +
             ((long)iStack_60._M_current - (long)local_68 & 0xffffffffffffffc0U));
        lVar14 = lVar14 + 1;
        __it._M_current = local_68;
        do {
          bVar9 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                  ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                                *)&local_48,__it);
          iVar15._M_current = __it._M_current;
          if (bVar9) goto LAB_001b1d7a;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                  ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                                *)&local_48,__it._M_current + 1);
          iVar15._M_current = __it._M_current + 1;
          if (bVar9) goto LAB_001b1d7a;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                  ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                                *)&local_48,__it._M_current + 2);
          iVar15._M_current = __it._M_current + 2;
          if (bVar9) goto LAB_001b1d7a;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                  ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                                *)&local_48,__it._M_current + 3);
          iVar15._M_current = __it._M_current + 3;
          if (bVar9) goto LAB_001b1d7a;
          __it._M_current = __it._M_current + 4;
          lVar14 = lVar14 + -1;
        } while (1 < lVar14);
      }
      lVar14 = (long)iVar8._M_current - (long)__it_00._M_current >> 4;
      if (lVar14 == 1) {
LAB_001b1d63:
        bVar9 = __gnu_cxx::__ops::
                _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                              *)&local_48,__it_00);
        iVar15._M_current = __it_00._M_current;
        if (!bVar9) {
          iVar15._M_current = iVar8._M_current;
        }
      }
      else if (lVar14 == 2) {
LAB_001b1d43:
        bVar9 = __gnu_cxx::__ops::
                _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                              *)&local_48,__it_00);
        iVar15._M_current = __it_00._M_current;
        if (!bVar9) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_001b1d63;
        }
      }
      else {
        iVar15._M_current = iVar8._M_current;
        if ((lVar14 == 3) &&
           (bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::{lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)#2}>
                    ::operator()((_Iter_pred<(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                                  *)&local_48,__it_00), iVar15._M_current = __it_00._M_current,
           !bVar9)) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_001b1d43;
        }
      }
LAB_001b1d7a:
      if (iVar15._M_current != iVar8._M_current) {
        pBVar7 = (iVar15._M_current)->first;
        local_48.Data = (pBVar4->super_Node).name._M_dataplus._M_p;
        local_48.Length = (pBVar4->super_Node).name._M_string_length;
        __position._M_current =
             (pBVar7->mustScanAfterPaths).
             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar7->mustScanAfterPaths).
            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
          _M_realloc_insert<llvm::StringRef>(&pBVar7->mustScanAfterPaths,__position,&local_48);
        }
        else {
          (__position._M_current)->Data = local_48.Data;
          (__position._M_current)->Length = local_48.Length;
          ppSVar2 = &(pBVar7->mustScanAfterPaths).
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar2 = *ppSVar2 + 1;
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != local_38);
  }
  if (local_68 != (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

void deferScanningUnownedInputsUntilSubpathsAvailable() {
    auto unownedDirectoryInputNodesAndConsumingCommands = std::vector<std::pair<BuildNode*, Command*>>();
    std::copy_if(directoryInputNodesAndCommands.begin(),
                 directoryInputNodesAndCommands.end(),
                 std::back_inserter(unownedDirectoryInputNodesAndConsumingCommands),
                 [this](const std::pair<BuildNode*, Command*> directoryInputNodeAndCommand) -> bool {
      return isIncludedUnownedNode(directoryInputNodeAndCommand.first) && directoryInputNodeAndCommand.second->repairViaOwnershipAnalysis;
    });

    // For each output node and its producing command (e.g. "unowned-directory/a.txt" and "TaskA"),
    // check if there exists an unowned node (e.g. "unowned-directory/" used by "TaskC") that is a parent of the produced node.
    // Only add "a.txt" to mustScanAfterPaths of "unowned-directory/" if TaskC is marked as "repairViaOwnershipAnalysis".
    for (auto outputNodeAndCommand: outputNodesAndCommands) {
      auto repairableUnownedNode =
        std::find_if(unownedDirectoryInputNodesAndConsumingCommands.begin(),
                     unownedDirectoryInputNodesAndConsumingCommands.end(),
                     [=](std::pair<BuildNode*, Command*> unownedDirectoryAndCommand) -> bool {
          return outputNodeAndCommand.first->getName().startswith(unownedDirectoryAndCommand.first->getName()) && outputNodeAndCommand.second->repairViaOwnershipAnalysis == true;
      });
      
      if (repairableUnownedNode != unownedDirectoryInputNodesAndConsumingCommands.end()) {
        (*repairableUnownedNode).first->mustScanAfterPaths.push_back(outputNodeAndCommand.first->getName());
      }
    }
  }